

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O2

adt_error_t adt_ary_splice(adt_ary_t *self,int32_t s32Index,int32_t s32Len)

{
  int iVar1;
  adt_error_t aVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  bool bVar6;
  
  aVar2 = '\x01';
  if (0 < s32Len && self != (adt_ary_t *)0x0) {
    if (s32Index < 0) {
      iVar3 = self->s32CurLen;
      if (SBORROW4(iVar3,-s32Index) != iVar3 + s32Index < 0) {
        return '\x03';
      }
      s32Index = s32Index + iVar3;
    }
    else {
      iVar3 = self->s32CurLen;
      if (iVar3 <= s32Index) {
        return '\x03';
      }
    }
    iVar1 = s32Index + s32Len;
    aVar2 = '\x04';
    if (iVar1 <= iVar3) {
      if ((self->destructorEnable == true) && (self->pDestructor != (_func_void_void_ptr *)0x0)) {
        uVar4 = (ulong)(uint)s32Len;
        lVar5 = (long)s32Index;
        while (bVar6 = uVar4 != 0, uVar4 = uVar4 - 1, bVar6) {
          (*self->pDestructor)(self->pFirst[lVar5]);
          lVar5 = lVar5 + 1;
        }
        iVar3 = self->s32CurLen;
      }
      if (iVar3 - iVar1 != 0 && iVar1 <= iVar3) {
        adt_block_memmove((uint8_t *)(self->pFirst + s32Index),(uint8_t *)(self->pFirst + iVar1),
                          (iVar3 - iVar1) * 8);
        iVar3 = self->s32CurLen;
      }
      self->s32CurLen = iVar3 - s32Len;
      aVar2 = '\0';
    }
  }
  return aVar2;
}

Assistant:

adt_error_t adt_ary_splice(adt_ary_t *self,int32_t s32Index, int32_t s32Len){
   if ((self!=0) && (s32Len > 0)) {
      int32_t s32Source;
      int32_t s32Destination;
      int32_t i;
      int32_t s32ElemsRemain;


      if(s32Index<0){
         s32Index = (-s32Index);
         if(s32Index > (self->s32CurLen) ){
            return ADT_INDEX_OUT_OF_BOUNDS_ERROR;
         }
         s32Index=self->s32CurLen-s32Index;
      }
      else if(s32Index >= self->s32CurLen){
         return ADT_INDEX_OUT_OF_BOUNDS_ERROR;
      }

      s32Destination = s32Index;
      s32Source = s32Index + s32Len;

      if (s32Source > self->s32CurLen) {
         return ADT_LENGTH_ERROR; //s32Len is too large
      }

      //call destructor on elements about to be removed
      if( (self->destructorEnable != 0) && (self->pDestructor != 0) ){
         for (i=0;i<s32Len; i++) {
            self->pDestructor(self->pFirst[s32Destination+i]);
         }
      }
      s32ElemsRemain = self->s32CurLen-s32Source;
      if (s32ElemsRemain > 0) {
         uint32_t u32BytesRemain;
         uint8_t* pDest;
         uint8_t* pSrc;
         pDest = (uint8_t*) &self->pFirst[s32Destination];
         pSrc = (uint8_t*) &self->pFirst[s32Source];
         u32BytesRemain = ((uint32_t)s32ElemsRemain) * ((uint32_t) ELEM_SIZE);
         adt_block_memmove(pDest, pSrc, u32BytesRemain);
      }
      self->s32CurLen-=s32Len;
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;

}